

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void la_list_free_full(la_list *l,_func_void_varargs *node_free)

{
  la_list *in_RSI;
  undefined8 *in_RDI;
  _func_void_varargs *in_stack_ffffffffffffffe8;
  
  if (in_RDI != (undefined8 *)0x0) {
    la_list_free_full(in_RSI,in_stack_ffffffffffffffe8);
    in_RDI[1] = 0;
    if (in_RSI == (la_list *)0x0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    else {
      (*(code *)in_RSI)(*in_RDI);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void la_list_free_full(la_list *l, void (*node_free)()) {
	if(l == NULL) {
		return;
	}
	la_list_free_full(l->next, node_free);
	l->next = NULL;
	if(node_free != NULL) {
		node_free(l->data);
	} else {
		LA_XFREE(l->data);
	}
	LA_XFREE(l);
}